

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Izhikevich.cpp
# Opt level: O2

void __thiscall
Izhikevich::Izhikevich(Izhikevich *this,long n_populationID,int n_neuronID,Izhikevich_param *param)

{
  Logging *pLVar1;
  
  (this->super_Neuron)._vptr_Neuron = (_func_int **)&PTR_update_00130a98;
  this->input_current = 0.0;
  this->input_spike = 0.0;
  this->param = param;
  (this->super_Neuron).populationID = n_populationID;
  (this->super_Neuron).neuronID = n_neuronID;
  this->v = param->c;
  this->u = 0.0;
  pLVar1 = Logging::getInstance();
  (this->super_Neuron).logger = pLVar1;
  return;
}

Assistant:

Izhikevich::Izhikevich(long n_populationID, int n_neuronID, Izhikevich_param* param) : param(param) {
    populationID = n_populationID;
    neuronID = n_neuronID;
    v = param->c;
    u = 0.0;
    initialize();
}